

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataconvertergenerator.cpp
# Opt level: O3

string * __thiscall
DataConverterGenerator::functionToString_abi_cxx11_
          (string *__return_storage_ptr__,DataConverterGenerator *this,int converterIndex)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  undefined1 *puVar3;
  int iVar4;
  long *plVar5;
  undefined8 *puVar6;
  long *plVar7;
  size_type *psVar8;
  char *tmp_finish;
  reference rVar9;
  string indexString;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string local_c0;
  undefined1 *local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_58 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  iVar4 = converterIndex + 1;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  local_c0.field_2._8_8_ = (long)&local_c0._M_dataplus._M_p + 2;
  puVar3 = (undefined1 *)((long)&local_c0.field_2 + 7);
  iVar2 = -iVar4;
  if (0 < iVar4) {
    iVar2 = iVar4;
  }
  local_e0._M_dataplus._M_p._0_4_ = iVar2;
  local_e0.field_2._M_local_buf[0] = 0x30;
  local_e0.field_2._M_allocated_capacity._4_4_ = 0x30;
  local_e0._M_string_length = (size_type)puVar3;
  local_a0 = puVar3;
  local_c0.field_2._8_8_ =
       boost::detail::lcast_put_unsigned<std::char_traits<char>,_unsigned_int,_char>::convert
                 ((lcast_put_unsigned<std::char_traits<char>,_unsigned_int,_char> *)&local_e0);
  if (converterIndex < -1) {
    *(char *)(local_c0.field_2._8_8_ + -1) = '-';
    local_c0.field_2._8_8_ = local_c0.field_2._8_8_ + -1;
  }
  local_a0 = puVar3;
  std::__cxx11::string::replace
            ((ulong)&local_98,0,(char *)local_98._M_string_length,local_c0.field_2._8_8_);
  getConverterFunction_abi_cxx11_(&local_c0,this,converterIndex);
  iVar4 = std::__cxx11::string::compare((char *)&local_c0);
  paVar1 = &local_c0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if (iVar4 == 0) {
    std::operator+(&local_50,"      mux",&local_98);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_68 = *plVar7;
      lStack_60 = plVar5[3];
      local_78 = &local_68;
    }
    else {
      local_68 = *plVar7;
      local_78 = (long *)*plVar5;
    }
    local_70 = plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_78,(ulong)local_98._M_dataplus._M_p);
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    psVar8 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_e0.field_2._M_allocated_capacity = *psVar8;
      local_e0.field_2._8_8_ = plVar5[3];
    }
    else {
      local_e0.field_2._M_allocated_capacity = *psVar8;
      local_e0._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_e0._M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_e0);
    paVar1 = &local_c0.field_2;
    psVar8 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_c0.field_2._M_allocated_capacity = *psVar8;
      local_c0.field_2._8_8_ = plVar5[3];
      local_c0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_c0.field_2._M_allocated_capacity = *psVar8;
      local_c0._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_c0._M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    if (local_78 != &local_68) {
      operator_delete(local_78,local_68 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    rVar9 = std::vector<bool,_std::allocator<bool>_>::at(&this->verbose_,(long)converterIndex);
    if ((*rVar9._M_p & rVar9._M_mask) == 0) goto LAB_001128f1;
    std::operator+(&local_e0,"      std::cout << \"value on index \" << i << \": \" << mux",
                   &local_98);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_e0);
    psVar8 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_c0.field_2._M_allocated_capacity = *psVar8;
      local_c0.field_2._8_8_ = plVar5[3];
      local_c0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_c0.field_2._M_allocated_capacity = *psVar8;
      local_c0._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_c0._M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_c0._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) {
LAB_001128cd:
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    getConverterFunction_abi_cxx11_(&local_c0,this,converterIndex);
    iVar4 = std::__cxx11::string::compare((char *)&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if (iVar4 != 0) {
      getConverterFunction_abi_cxx11_(&local_c0,this,converterIndex);
      iVar4 = std::__cxx11::string::compare((char *)&local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != paVar1) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      if (iVar4 == 0) {
        rVar9 = std::vector<bool,_std::allocator<bool>_>::at(&this->verbose_,(long)converterIndex);
        if ((*rVar9._M_p & rVar9._M_mask) != 0) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      goto LAB_001128f1;
    }
    std::operator+(&local_50,"      mux",&local_98);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_68 = *plVar7;
      lStack_60 = plVar5[3];
      local_78 = &local_68;
    }
    else {
      local_68 = *plVar7;
      local_78 = (long *)*plVar5;
    }
    local_70 = plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_78,(ulong)local_98._M_dataplus._M_p);
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    psVar8 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_e0.field_2._M_allocated_capacity = *psVar8;
      local_e0.field_2._8_8_ = plVar5[3];
    }
    else {
      local_e0.field_2._M_allocated_capacity = *psVar8;
      local_e0._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_e0._M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_e0);
    psVar8 = puVar6 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_c0.field_2._M_allocated_capacity = *psVar8;
      local_c0.field_2._8_8_ = puVar6[3];
      local_c0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_c0.field_2._M_allocated_capacity = *psVar8;
      local_c0._M_dataplus._M_p = (pointer)*puVar6;
    }
    local_c0._M_string_length = puVar6[1];
    *puVar6 = psVar8;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    if (local_78 != &local_68) {
      operator_delete(local_78,local_68 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    rVar9 = std::vector<bool,_std::allocator<bool>_>::at(&this->verbose_,(long)converterIndex);
    if ((*rVar9._M_p & rVar9._M_mask) == 0) goto LAB_001128f1;
    std::operator+(&local_e0,"      std::cout << \"value on index \" << i << \": \" << mux",
                   &local_98);
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_e0);
    psVar8 = puVar6 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_c0.field_2._M_allocated_capacity = *psVar8;
      local_c0.field_2._8_8_ = puVar6[3];
      local_c0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_c0.field_2._M_allocated_capacity = *psVar8;
      local_c0._M_dataplus._M_p = (pointer)*puVar6;
    }
    local_c0._M_string_length = puVar6[1];
    *puVar6 = psVar8;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_c0._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) goto LAB_001128cd;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
LAB_001128f1:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                             local_98.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DataConverterGenerator::functionToString(int converterIndex) { // >data[6] / (180/3.1415926));
  std::string functionCode;
  std::string indexString = boost::lexical_cast<std::string>(converterIndex + 1);

  if(getConverterFunction(converterIndex) == "deg_to_rad") {
    functionCode = "      mux" + indexString + ".get(i) = mux" + indexString + ".get(i).asDouble() / (180/3.1415926);\n";
    if(getConverterVerbose(converterIndex)) {
      functionCode += "      std::cout << \"value on index \" << i << \": \" << mux" + indexString + ".get(i).asDouble() << std::endl;\n";
    }
  } else if(getConverterFunction(converterIndex) == "none_double") {
    functionCode = "      mux" + indexString + ".get(i) = mux" + indexString + ".get(i).asDouble();\n";
      if(getConverterVerbose(converterIndex)) {
        functionCode += "      std::cout << \"value on index \" << i << \": \" << mux" + indexString + ".get(i).asDouble() << std::endl;\n";
      }
    } else if(getConverterFunction(converterIndex) == "none") {
        // do nothing
        if(getConverterVerbose(converterIndex)) {
          functionCode += "      std::cout << \"Dummy break. Sorry for my laziness.\" << std::endl;\n";
        }
        functionCode += "      break;\n";
      }

  return functionCode;
 }